

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getFormFieldsForPage
          (vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,QPDFPageObjectHelper *ph)

{
  bool bVar1;
  bool bVar2;
  QPDFObjGen og;
  pointer pQVar3;
  QPDFFormFieldObjectHelper field;
  set todo;
  QPDFObjectHandle local_180;
  pointer local_170;
  undefined **local_168;
  QPDFAcroFormDocumentHelper *local_160;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_158;
  QPDFAnnotationObjectHelper local_140;
  QPDFPageObjectHelper local_108;
  QPDFFormFieldObjectHelper local_d0;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_98;
  QPDFFormFieldObjectHelper local_68;
  
  local_160 = this;
  analyze(this);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ph->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (ph->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_108.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  local_168 = &PTR__QPDFObjectHelper_002f1ce8;
  local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ph->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (ph->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_108.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  local_108.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFPageObjectHelper_002ef088;
  local_108.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ph->m).super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (ph->m).super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_108.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_108.m.
            super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_108.m.
            super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  getWidgetAnnotationsForPage(&local_158,this,&local_108);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_108);
  local_170 = local_158.
              super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_158.
      super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_158.
      super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pQVar3 = local_158.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar3->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pQVar3->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_140.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar3->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pQVar3->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_140.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_140.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFAnnotationObjectHelper_002ef050;
      local_140.m.
      super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar3->m).
           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_140.m.
      super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pQVar3->m).
           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_140.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140.m.
           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_140.m.
                super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140.m.
           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_140.m.
                super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      getFieldForAnnotation(&local_68,local_160,&local_140);
      QPDFFormFieldObjectHelper::getTopLevelField(&local_d0,&local_68,(bool *)0x0);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_140);
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                     (&local_d0.super_QPDFObjectHelper.super_BaseHandle);
      bVar1 = QPDFObjGen::set::add((set *)&local_98,og);
      if (bVar1) {
        local_180.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_180.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        bVar2 = QPDFObjectHandle::isDictionary(&local_180);
      }
      else {
        bVar2 = false;
      }
      if ((bVar1) &&
         (local_180.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_180.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (bVar2 != false) {
        std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
        push_back(__return_storage_ptr__,&local_d0);
      }
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_d0);
      pQVar3 = pQVar3 + 1;
    } while (pQVar3 != local_170);
  }
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
            (&local_158);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFFormFieldObjectHelper>
QPDFAcroFormDocumentHelper::getFormFieldsForPage(QPDFPageObjectHelper ph)
{
    analyze();
    QPDFObjGen::set todo;
    std::vector<QPDFFormFieldObjectHelper> result;
    for (auto& annot: getWidgetAnnotationsForPage(ph)) {
        auto field = getFieldForAnnotation(annot).getTopLevelField();
        if (todo.add(field) && field.getObjectHandle().isDictionary()) {
            result.push_back(field);
        }
    }
    return result;
}